

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

void mzapmsg(monst *mtmp,obj *otmp,boolean self)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  boolean self_local;
  obj *otmp_local;
  monst *mtmp_local;
  
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_0026382a;
      bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x0026379b;
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
joined_r0x0026379b:
    if (bVar1 == 0) goto LAB_0026382a;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0))
      && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    if (self != '\0') {
      pcVar3 = Monnam(mtmp);
      iVar2 = pronoun_gender(level,mtmp);
      pcVar5 = genders[iVar2].him;
      pcVar4 = doname(otmp);
      pline("%s zaps %sself with %s!",pcVar3,pcVar5,pcVar4);
      return;
    }
    pcVar5 = Monnam(mtmp);
    pcVar3 = xname(otmp);
    pcVar3 = an(pcVar3);
    pline("%s zaps %s!",pcVar5,pcVar3);
    stop_occupation();
    return;
  }
LAB_0026382a:
  if (flags.soundok != '\0') {
    iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
    pcVar5 = "distant";
    if (iVar2 < 0x52) {
      pcVar5 = "nearby";
    }
    You_hear("a %s zap.",pcVar5);
  }
  return;
}

Assistant:

static void mzapmsg(struct monst *mtmp, struct obj *otmp, boolean self)
{
	if (!canseemon(level, mtmp)) {
		if (flags.soundok)
			You_hear("a %s zap.",
					(distu(mtmp->mx,mtmp->my) <= (BOLT_LIM+1)*(BOLT_LIM+1)) ?
					"nearby" : "distant");
	} else if (self)
		pline("%s zaps %sself with %s!",
		      Monnam(mtmp), mhim(level, mtmp), doname(otmp));
	else {
		pline("%s zaps %s!", Monnam(mtmp), an(xname(otmp)));
		stop_occupation();
	}
}